

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O3

ssize_t __thiscall testbench::memory::write(memory *this,int __fd,void *__buf,size_t __n)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  ssize_t in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ssize_t extraout_RAX;
  ssize_t sVar4;
  undefined4 extraout_var_02;
  ssize_t extraout_RAX_00;
  pointer psVar5;
  undefined4 extraout_var_01;
  
  psVar5 = (this->ranges).
           super__Vector_base<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->ranges).
           super__Vector_base<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar5 == psVar1) {
      return in_RAX;
    }
    peVar2 = (psVar5->super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    this_00 = (psVar5->super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar3 = (*peVar2->_vptr_address_range[1])(peVar2);
    in_RAX = CONCAT44(extraout_var,iVar3);
    if ((char)iVar3 != '\0') {
      iVar3 = (*peVar2->_vptr_address_range[2])(peVar2,__fd);
      in_RAX = CONCAT44(extraout_var_00,iVar3);
      if ((char)iVar3 != '\0') {
        iVar3 = (**peVar2->_vptr_address_range)(peVar2);
        sVar4 = CONCAT44(extraout_var_01,iVar3);
        if ((char)iVar3 != '\0') {
          iVar3 = (*peVar2->_vptr_address_range[4])(peVar2,__fd,(ulong)__buf & 0xff);
          sVar4 = CONCAT44(extraout_var_02,iVar3);
        }
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return sVar4;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        return extraout_RAX_00;
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RAX = extraout_RAX;
    }
    psVar5 = psVar5 + 1;
  } while( true );
}

Assistant:

void memory::write(unsigned address, unsigned char value) noexcept
{
    for (auto range : ranges) {
        if (range->is_visible() and range->contains(address)) {
            if (range->is_writable()) {
                range->write(address, value);
            }
            return;
        }
    }
}